

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam_hdr_t * bam_hdr_dup(bam_hdr_t *h0)

{
  char *pcVar1;
  uint32_t *puVar2;
  char **ppcVar3;
  int local_24;
  int i;
  bam_hdr_t *h;
  bam_hdr_t *h0_local;
  
  if (h0 == (bam_hdr_t *)0x0) {
    h0_local = (bam_hdr_t *)0x0;
  }
  else {
    h0_local = bam_hdr_init();
    if (h0_local == (bam_hdr_t *)0x0) {
      h0_local = (bam_hdr_t *)0x0;
    }
    else {
      h0_local->n_targets = h0->n_targets;
      h0_local->ignore_sam_err = h0->ignore_sam_err;
      h0_local->l_text = h0->l_text;
      h0_local->cigar_tab = (int8_t *)0x0;
      h0_local->sdict = (void *)0x0;
      pcVar1 = (char *)calloc((ulong)(h0_local->l_text + 1),1);
      h0_local->text = pcVar1;
      memcpy(h0_local->text,h0->text,(ulong)h0_local->l_text);
      puVar2 = (uint32_t *)calloc((long)h0_local->n_targets,4);
      h0_local->target_len = puVar2;
      ppcVar3 = (char **)calloc((long)h0_local->n_targets,8);
      h0_local->target_name = ppcVar3;
      for (local_24 = 0; local_24 < h0_local->n_targets; local_24 = local_24 + 1) {
        h0_local->target_len[local_24] = h0->target_len[local_24];
        pcVar1 = strdup(h0->target_name[local_24]);
        h0_local->target_name[local_24] = pcVar1;
      }
    }
  }
  return h0_local;
}

Assistant:

bam_hdr_t *bam_hdr_dup(const bam_hdr_t *h0)
{
    if (h0 == NULL) return NULL;
    bam_hdr_t *h;
    if ((h = bam_hdr_init()) == NULL) return NULL;
    // copy the simple data
    h->n_targets = h0->n_targets;
    h->ignore_sam_err = h0->ignore_sam_err;
    h->l_text = h0->l_text;
    // Then the pointery stuff
    h->cigar_tab = NULL;
    h->sdict = NULL;
    h->text = (char*)calloc(h->l_text + 1, 1);
    memcpy(h->text, h0->text, h->l_text);
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    int i;
    for (i = 0; i < h->n_targets; ++i) {
        h->target_len[i] = h0->target_len[i];
        h->target_name[i] = strdup(h0->target_name[i]);
    }
    return h;
}